

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall cali::Caliper::end(Caliper *this,Attribute *attr)

{
  ThreadData *pTVar1;
  ulong uVar2;
  GlobalData *pGVar3;
  pointer pCVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  cali_id_t cVar8;
  Node *pNVar9;
  ulong uVar10;
  cali_id_t cVar11;
  uint uVar12;
  ulong uVar13;
  Channel *channel;
  pointer pCVar14;
  mutex *pmVar15;
  Blackboard *pBVar16;
  Entry merged_entry;
  ulong local_a8;
  Entry local_98;
  ulong local_78;
  Node *local_70;
  Node *local_68;
  Entry local_60;
  Node *local_48;
  anon_union_8_7_33918203_for_value aStack_40;
  element_type *local_38;
  
  if (this->sT->stack_error != false) {
    return;
  }
  uVar5 = Attribute::properties(attr);
  uVar12 = uVar5 & 0x3c;
  if (attr->m_node == (Node *)0x0) {
    local_a8 = 0xffffffffffffffff;
  }
  else {
    local_a8 = attr->m_node->m_id;
  }
  local_78 = (ulong)((uVar5 >> 10 & 1) != 0) + 1;
  uVar13 = local_a8;
  if ((uVar5 & 1) == 0) {
    uVar13 = local_78;
  }
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  uVar10 = uVar13;
  if (uVar12 == 0x14) {
    do {
      uVar7 = (ulong)(uint)(((int)uVar10 + (int)(uVar10 / 0x3fd) * -0x3fd) * 0x20);
      uVar2 = *(ulong *)((long)&(pTVar1->thread_blackboard).hashtable[0].key + uVar7);
      if (uVar2 == uVar13) break;
      uVar10 = uVar10 % 0x3fd + 1;
    } while (uVar2 != 0xffffffffffffffff);
    if (uVar2 == uVar13) {
      local_98.m_value.m_v.value =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.value + uVar7);
      local_98.m_node =
           *(Node **)((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_node + uVar7);
      local_98.m_value.m_v.type_and_size =
           *(uint64_t *)
            ((long)&(pTVar1->thread_blackboard).hashtable[0].value.m_value.m_v.type_and_size + uVar7
            );
    }
    else {
      local_98.m_node = (Node *)0x0;
      local_98.m_value.m_v.type_and_size = 0;
      local_98.m_value.m_v.value.v_uint = 0;
    }
    Entry::get(&local_60,&local_98,attr);
    cVar8 = 0xffffffffffffffff;
    cVar11 = 0xffffffffffffffff;
    if ((local_98.m_node != (Node *)0x0) && (cVar11 = (local_98.m_node)->m_attribute, cVar11 == 8))
    {
      cVar11 = (local_98.m_node)->m_id;
    }
    if (attr->m_node != (Node *)0x0) {
      cVar8 = attr->m_node->m_id;
    }
    if (cVar11 == cVar8) {
LAB_001df782:
      local_48 = (Node *)local_60.m_value.m_v.type_and_size;
      aStack_40 = local_60.m_value.m_v.value;
      local_68 = local_98.m_node;
      local_70 = local_60.m_node;
    }
    else {
      if (local_60.m_node == (Node *)0x0) {
        pNVar9 = (Node *)0x0;
      }
      else {
        pNVar9 = local_98.m_node;
        if (uVar13 == 2) goto LAB_001df782;
      }
      anon_unknown.dwarf_408129::log_stack_error(pNVar9,attr);
      local_48 = (Node *)0x0;
      aStack_40.v_uint = 0;
      local_70 = (Node *)0x0;
      local_68 = (Node *)0x0;
    }
  }
  else {
    if (uVar12 != 0xc) goto LAB_001dfa39;
    pmVar15 = &this->sG->process_blackboard_lock;
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)pmVar15);
    if (iVar6 != 0) {
      std::__throw_system_error(iVar6);
    }
    pGVar3 = this->sG;
    do {
      uVar7 = (ulong)(uint)(((int)uVar10 + (int)(uVar10 / 0x3fd) * -0x3fd) * 0x20);
      uVar2 = *(ulong *)((long)&(pGVar3->process_blackboard).hashtable[0].key + uVar7);
      if (uVar2 == uVar13) break;
      uVar10 = uVar10 % 0x3fd + 1;
    } while (uVar2 != 0xffffffffffffffff);
    if (uVar2 == uVar13) {
      local_98.m_value.m_v.value =
           *(anon_union_8_7_33918203_for_value *)
            ((long)&(pGVar3->process_blackboard).hashtable[0].value.m_value.m_v.value + uVar7);
      local_98.m_node =
           *(Node **)((long)&(pGVar3->process_blackboard).hashtable[0].value.m_node + uVar7);
      local_98.m_value.m_v.type_and_size =
           *(uint64_t *)
            ((long)&(pGVar3->process_blackboard).hashtable[0].value.m_value.m_v.type_and_size +
            uVar7);
    }
    else {
      local_98.m_node = (Node *)0x0;
      local_98.m_value.m_v.type_and_size = 0;
      local_98.m_value.m_v.value.v_uint = 0;
    }
    Entry::get(&local_60,&local_98,attr);
    cVar8 = 0xffffffffffffffff;
    cVar11 = 0xffffffffffffffff;
    if ((local_98.m_node != (Node *)0x0) && (cVar11 = (local_98.m_node)->m_attribute, cVar11 == 8))
    {
      cVar11 = (local_98.m_node)->m_id;
    }
    if (attr->m_node != (Node *)0x0) {
      cVar8 = attr->m_node->m_id;
    }
    if (cVar11 == cVar8) {
LAB_001df7fb:
      local_48 = (Node *)local_60.m_value.m_v.type_and_size;
      aStack_40 = local_60.m_value.m_v.value;
      local_68 = local_98.m_node;
      local_70 = local_60.m_node;
    }
    else {
      if (local_60.m_node == (Node *)0x0) {
        pNVar9 = (Node *)0x0;
      }
      else {
        pNVar9 = local_98.m_node;
        if (uVar13 == 2) goto LAB_001df7fb;
      }
      anon_unknown.dwarf_408129::log_stack_error(pNVar9,attr);
      local_48 = (Node *)0x0;
      aStack_40.v_uint = 0;
      local_68 = (Node *)0x0;
      local_70 = (Node *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar15);
  }
  if (local_70 == (Node *)0x0) {
    this->sT->stack_error = true;
    goto LAB_001dfa39;
  }
  if ((uVar5 & 0x40) == 0) {
    pCVar14 = (this->sG->active_channels).
              super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar4 = (this->sG->active_channels).
             super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar14 != pCVar4) {
      do {
        local_38 = (pCVar14->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        local_98.m_node = local_48;
        local_98.m_value.m_v.type_and_size = aStack_40.v_uint;
        local_60.m_node = (Node *)this;
        util::
        callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
        ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                      *)&(local_38->events).pre_end_evt,(Caliper **)&local_60,&local_38,attr,
                     (Variant *)&local_98);
        pCVar14 = pCVar14 + 1;
      } while (pCVar14 != pCVar4);
    }
  }
  if (uVar12 == 0x14) {
    pBVar16 = &this->sT->thread_blackboard;
    if ((uVar5 & 1) == 0) {
      pNVar9 = *(Node **)((long)&(((local_68->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                 super_LockfreeIntrusiveTree<cali::Node>).m_me +
                         (local_68->super_LockfreeIntrusiveTree<cali::Node>).m_node);
      if (pNVar9 != (Node *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10)) {
        if (local_68 != local_70) {
          pNVar9 = internal::MetadataTree::remove_first_in_path(&this->sT->tree,local_68,attr);
        }
        local_98.m_value.m_v.type_and_size = (pNVar9->m_data).m_v.type_and_size;
        local_98.m_value.m_v.value = (pNVar9->m_data).m_v.value;
        local_98.m_node = pNVar9;
        Blackboard::set(pBVar16,local_78,&local_98,-1 < (char)uVar5);
        goto LAB_001dfa39;
      }
      local_a8 = local_78;
    }
    Blackboard::del(pBVar16,local_a8);
    goto LAB_001dfa39;
  }
  pmVar15 = &this->sG->process_blackboard_lock;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)pmVar15);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pBVar16 = &this->sG->process_blackboard;
  if ((uVar5 & 1) == 0) {
    pNVar9 = *(Node **)((long)&(((local_68->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                               super_LockfreeIntrusiveTree<cali::Node>).m_me +
                       (local_68->super_LockfreeIntrusiveTree<cali::Node>).m_node);
    if (pNVar9 == (Node *)((long)internal::MetadataTree::mG._M_b._M_p + 0x10)) {
      local_a8 = local_78;
      goto LAB_001dfa24;
    }
    if (local_68 != local_70) {
      pNVar9 = internal::MetadataTree::remove_first_in_path(&this->sT->tree,local_68,attr);
    }
    local_98.m_value.m_v.type_and_size = (pNVar9->m_data).m_v.type_and_size;
    local_98.m_value.m_v.value = (pNVar9->m_data).m_v.value;
    local_98.m_node = pNVar9;
    Blackboard::set(pBVar16,local_78,&local_98,-1 < (char)uVar5);
  }
  else {
LAB_001dfa24:
    Blackboard::del(pBVar16,local_a8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)pmVar15);
LAB_001dfa39:
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::end(const Attribute& attr)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t   key         = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty()) {
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}